

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

EnumValueDescriptorProto *
google::protobuf::descriptor_unittest::AddEnumValue
          (EnumDescriptorProto *enum_proto,string *name,int number)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar1;
  Arena *arena;
  
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                     (&(enum_proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  arena = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set<>(&(pVVar1->field_0)._impl_.name_,name,arena);
  (pVVar1->field_0)._impl_.number_ = number;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 4;
  return pVVar1;
}

Assistant:

EnumValueDescriptorProto* AddEnumValue(EnumDescriptorProto* enum_proto,
                                       const std::string& name, int number) {
  EnumValueDescriptorProto* result = enum_proto->add_value();
  result->set_name(name);
  result->set_number(number);
  return result;
}